

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O3

int db_traceback(lua_State *L)

{
  int idx;
  int iVar1;
  lua_State *L1;
  char *msg;
  lua_Integer lVar2;
  int arg;
  int local_2c;
  
  L1 = getthread(L,&local_2c);
  idx = local_2c + 1;
  msg = lua_tolstring(L,idx,(size_t *)0x0);
  if ((msg == (char *)0x0) && (iVar1 = lua_type(L,idx), 0 < iVar1)) {
    lua_pushvalue(L,idx);
    return 1;
  }
  lVar2 = luaL_optinteger(L,local_2c + 2,(ulong)(L1 == L));
  luaL_traceback(L,L1,msg,(int)lVar2);
  return 1;
}

Assistant:

static int db_traceback(lua_State *L) {
    int arg;
    lua_State *L1 = getthread(L, &arg);
    const char *msg = lua_tostring(L, arg + 1);
    if (msg == NULL && !lua_isnoneornil(L, arg + 1))  /* non-string 'msg'? */
        lua_pushvalue(L, arg + 1);  /* return it untouched */
    else {
        int level = (int) luaL_optinteger(L, arg + 2, (L == L1) ? 1 : 0);
        luaL_traceback(L, L1, msg, level);
    }
    return 1;
}